

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_array.c
# Opt level: O2

ares_array_t * ares_array_create(size_t member_size,ares_array_destructor_t destruct)

{
  ares_array_t *paVar1;
  
  if (member_size != 0) {
    paVar1 = (ares_array_t *)ares_malloc_zero(0x30);
    if (paVar1 == (ares_array_t *)0x0) {
      paVar1 = (ares_array_t *)0x0;
    }
    else {
      paVar1->member_size = member_size;
      paVar1->destruct = destruct;
    }
    return paVar1;
  }
  return (ares_array_t *)0x0;
}

Assistant:

ares_array_t *ares_array_create(size_t                  member_size,
                                ares_array_destructor_t destruct)
{
  ares_array_t *arr;

  if (member_size == 0) {
    return NULL;
  }

  arr = ares_malloc_zero(sizeof(*arr));
  if (arr == NULL) {
    return NULL;
  }

  arr->member_size = member_size;
  arr->destruct    = destruct;
  return arr;
}